

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_symbol_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue val;
  int iVar1;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar2;
  JSString *p;
  JSValue str;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  JSString *in_stack_ffffffffffffffa8;
  JSValueUnion ctx_00;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2.tag = in_RDX;
  JVar2.u.float64 = in_RSI.float64;
  iVar1 = JS_IsUndefined(JVar2);
  if (iVar1 == 0) {
    _local_10 = JS_ThrowTypeError(in_RDI,"not a constructor");
  }
  else {
    if ((in_ECX == 0) || (iVar1 = JS_IsUndefined(*in_R8), iVar1 != 0)) {
      ctx_00.float64 = 0.0;
    }
    else {
      val.tag._0_4_ = in_stack_ffffffffffffffa0;
      val.u = (JSValueUnion)in_stack_ffffffffffffff98;
      val.tag._4_4_ = in_stack_ffffffffffffffa4;
      JVar2 = JS_ToString((JSContext *)0x14faa0,val);
      in_stack_ffffffffffffffa4 = JVar2.u._4_4_;
      in_stack_ffffffffffffffa8 = (JSString *)JVar2.tag;
      ctx_00 = JVar2.u;
      iVar1 = JS_IsException(JVar2);
      if (iVar1 != 0) {
        local_10.ptr = (void *)(local_10 << 0x20);
        local_8 = 6;
        return _local_10;
      }
    }
    _local_10 = JS_NewSymbol((JSContext *)ctx_00.ptr,in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa4);
  }
  return _local_10;
}

Assistant:

static JSValue js_symbol_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue str;
    JSString *p;

    if (!JS_IsUndefined(new_target))
        return JS_ThrowTypeError(ctx, "not a constructor");
    if (argc == 0 || JS_IsUndefined(argv[0])) {
        p = NULL;
    } else {
        str = JS_ToString(ctx, argv[0]);
        if (JS_IsException(str))
            return JS_EXCEPTION;
        p = JS_VALUE_GET_STRING(str);
    }
    return JS_NewSymbol(ctx, p, JS_ATOM_TYPE_SYMBOL);
}